

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animation.cpp
# Opt level: O1

int main(void)

{
  pointer pbVar1;
  Pointf to;
  Pointf to_00;
  bool bVar2;
  TerminalInfo term_00;
  float fVar3;
  size_t sVar4;
  int iVar5;
  ostream *poVar6;
  int *piVar7;
  long lVar8;
  BrailleCanvas *this;
  margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *pmVar9;
  value_type *pvVar10;
  byte bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  Size char_sz;
  const_iterator __begin2;
  TerminalInfo term;
  RealCanvas<plot::BrailleCanvas> canvas;
  float local_334;
  Pointf local_328;
  value_type local_2c8;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  TerminalInfo local_230;
  margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> local_208;
  RealCanvas<plot::BrailleCanvas> local_198;
  Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> local_118;
  
  bVar11 = 0;
  signal(2,main::anon_class_1_0_00000001::__invoke);
  local_230.mode = None;
  local_230.foreground_color.r = 0.9;
  local_230.foreground_color.g = 0.9;
  local_230.foreground_color.b = 0.9;
  local_230.foreground_color.a = 1.0;
  local_230.background_color.r = 0.0;
  local_230.background_color.g = 0.0;
  local_230.background_color.b = 0.0;
  local_230.background_color.a = 1.0;
  local_230.term_ = 1;
  plot::TerminalInfo::detect<void>(&local_230);
  local_198.bounds_.p1.x = 0.0;
  local_198.bounds_.p1.y = 1.0;
  local_198.bounds_.p2.x = 1.0;
  local_198.bounds_.p2.y = -1.0;
  term_00.term_ = local_230.term_;
  term_00.background_color.a = local_230.background_color.a;
  term_00.foreground_color.r = local_230.foreground_color.r;
  term_00.mode = local_230.mode;
  term_00.foreground_color.b = local_230.foreground_color.b;
  term_00.foreground_color.g = local_230.foreground_color.g;
  term_00.background_color.r = local_230.background_color.r;
  term_00.foreground_color.a = local_230.foreground_color.a;
  term_00.background_color.b = local_230.background_color.b;
  term_00.background_color.g = local_230.background_color.g;
  char_sz.y = 7;
  char_sz.x = 0x1e;
  plot::BrailleCanvas::BrailleCanvas(&local_198.canvas_,char_sz,term_00);
  local_118.block_.term_.term_ = local_230.term_;
  local_118.block_.term_.background_color.a = local_230.background_color.a;
  local_118.block_.term_.foreground_color.r = local_230.foreground_color.r;
  local_118.block_.term_.mode = local_230.mode;
  local_118.block_.term_.foreground_color.b = local_230.foreground_color.b;
  local_118.block_.term_.foreground_color.g = local_230.foreground_color.g;
  local_118.block_.term_.background_color.r = local_230.background_color.r;
  local_118.block_.term_.foreground_color.a = local_230.foreground_color.a;
  local_118.block_.term_.background_color.b = local_230.background_color.b;
  local_118.block_.term_.background_color.g = local_230.background_color.g;
  local_118.block_.label_._M_len = 0;
  local_118.block_.label_._M_str = (char *)0x0;
  local_118.block_.align_ = Left;
  local_118.block_.border_.top_left._M_len = 3;
  local_118.block_.border_.top_left._M_str = anon_var_dwarf_97f9;
  local_118.block_.border_.top._M_len = 3;
  local_118.block_.border_.top._M_str = anon_var_dwarf_9724;
  local_118.block_.border_.top_right._M_len = 3;
  local_118.block_.border_.top_right._M_str = anon_var_dwarf_980e;
  local_118.block_.border_.left._M_len = 3;
  local_118.block_.border_.left._M_str = anon_var_dwarf_9730;
  local_118.block_.border_.right._M_len = 3;
  local_118.block_.border_.right._M_str = anon_var_dwarf_9730;
  local_118.block_.border_.bottom_left._M_len = 3;
  local_118.block_.border_.bottom_left._M_str = anon_var_dwarf_9823;
  local_118.block_.border_.bottom._M_len = 3;
  local_118.block_.border_.bottom._M_str = anon_var_dwarf_9724;
  local_118.block_.border_.bottom_right._M_len = 3;
  local_118.block_.border_.bottom_right._M_str = anon_var_dwarf_9838;
  local_118.top_ = 1;
  local_118.right_ = 2;
  local_118.bottom_ = 1;
  local_118.left_ = 2;
  fVar3 = local_198.bounds_.p1.x;
  fVar12 = local_198.bounds_.p2.x - local_198.bounds_.p1.x;
  fVar16 = local_198.bounds_.p2.y - local_198.bounds_.p1.y;
  fVar17 = -fVar12;
  if (-fVar12 <= fVar12) {
    fVar17 = fVar12;
  }
  fVar12 = -fVar16;
  if (-fVar16 <= fVar16) {
    fVar12 = fVar16;
  }
  fVar17 = (1.0 / (float)(long)(local_198.canvas_.cols_ * 2 + -1)) * fVar17;
  fVar12 = fVar12 * 0.5;
  fVar16 = local_198.bounds_.p2.x + fVar17;
  local_258._8_4_ = local_198.bounds_.p1.y;
  local_258._0_8_ = (ulong)local_198.bounds_.p1 & 0xffffffff;
  local_258._12_4_ = 0;
  local_248._8_4_ = local_198.bounds_.p2.y;
  local_248._0_8_ = (ulong)local_198.bounds_.p2 & 0xffffffff;
  local_248._12_4_ = 0;
  local_334 = 0.0;
  local_118.block_.block_ = &local_198;
  while( true ) {
    this = &local_198.canvas_;
    local_208.margin_ = (Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)0x0;
    local_208.overflow_ = 0;
    local_208.line_.line_.frame_._0_4_ = 0;
    std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>::
    _M_fill_assign(&local_198.canvas_.blocks_.
                    super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                   ,((long)local_198.canvas_.blocks_.
                           super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                           .
                           super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_198.canvas_.blocks_.
                           super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                           .
                           super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,
                   (value_type *)&local_208);
    plot::BrailleCanvas::push(this);
    fVar13 = (fVar3 + local_334) * 12.566368;
    fVar14 = sinf(fVar13);
    if ((fVar17 != 0.0) || (NAN(fVar17))) {
      local_328.y = fVar14 * fVar12;
      local_328.x = fVar3;
      fVar14 = fVar3;
      while( true ) {
        fVar14 = fVar14 + fVar17;
        bVar2 = fVar14 <= fVar16;
        if (0.0 < fVar17) {
          bVar2 = fVar16 <= fVar14;
        }
        if ((bVar2) ||
           ((((fVar17 == 0.0 && (!NAN(fVar17))) && (fVar14 == 0.0)) &&
            (((!NAN(fVar14) && (fVar16 == 0.0)) && (!NAN(fVar16))))))) break;
        fVar15 = sinf((local_334 + fVar14) * 12.566368);
        to.y = fVar15 * fVar12;
        to.x = fVar14;
        plot::RealCanvas<plot::BrailleCanvas>::line<>
                  (&local_198,(Color *)plot::palette::royalblue,local_328,to);
        local_328.y = fVar15 * fVar12;
        local_328.x = fVar14;
      }
    }
    plot::BrailleCanvas::pop(this,Over);
    plot::BrailleCanvas::push(this);
    fVar13 = cosf(fVar13);
    if ((fVar17 != 0.0) || (NAN(fVar17))) {
      local_328.y = fVar13 * fVar12;
      local_328.x = fVar3;
      fVar13 = fVar3;
      while( true ) {
        fVar13 = fVar13 + fVar17;
        bVar2 = fVar13 <= fVar16;
        if (0.0 < fVar17) {
          bVar2 = fVar16 <= fVar13;
        }
        if ((bVar2) ||
           ((((fVar17 == 0.0 && (!NAN(fVar17))) && (fVar13 == 0.0)) &&
            (((!NAN(fVar13) && (fVar16 == 0.0)) && (!NAN(fVar16))))))) break;
        fVar14 = cosf((local_334 + fVar13) * 12.566368);
        to_00.y = fVar14 * fVar12;
        to_00.x = fVar13;
        plot::RealCanvas<plot::BrailleCanvas>::line<>
                  (&local_198,(Color *)plot::palette::red,local_328,to_00);
        local_328.y = fVar14 * fVar12;
        local_328.x = fVar13;
      }
    }
    plot::BrailleCanvas::pop(this,Over);
    local_208.margin_ =
         (Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)
         CONCAT44(local_208.margin_._4_4_,2);
    plot::RealCanvas<plot::BrailleCanvas>::line<plot::TerminalOp>
              (&local_198,&local_230.foreground_color,(Pointf)local_258._0_8_,
               (Pointf)local_248._0_8_,(TerminalOp *)&local_208);
    sVar4 = local_118.bottom_;
    local_2c8.overflow_ = -local_118.top_;
    local_2c8.line_.line_.line_.line_.canvas_ = &(local_118.block_.block_)->canvas_;
    local_2c8.line_.line_.line_.line_.it_._M_current =
         ((local_118.block_.block_)->canvas_).blocks_.
         super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
         .
         super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_2c8.line_.line_.end_.line_.it_._M_current =
         ((local_118.block_.block_)->canvas_).blocks_.
         super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
         .
         super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_2c8.margin_ = &local_118;
    local_2c8.line_.line_.frame_ = &local_118.block_;
    local_2c8.line_.line_.overflow_ = -1;
    local_2c8.end_.line_.overflow_ = 1;
    pbVar1 = ((local_118.block_.block_)->canvas_).blocks_.
             super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             .
             super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_2c8.line_.line_.end_.line_.canvas_ = local_2c8.line_.line_.line_.line_.canvas_;
    local_2c8.end_.line_.frame_ = local_2c8.line_.line_.frame_;
    local_2c8.end_.line_.line_.line_.canvas_ = local_2c8.line_.line_.line_.line_.canvas_;
    local_2c8.end_.line_.line_.line_.it_._M_current =
         local_2c8.line_.line_.end_.line_.it_._M_current;
    local_2c8.end_.line_.end_.line_.canvas_ = local_2c8.line_.line_.line_.line_.canvas_;
    local_2c8.end_.line_.end_.line_.it_._M_current = local_2c8.line_.line_.end_.line_.it_._M_current
    ;
    do {
      if ((local_230.mode != None) && (local_230.mode != Windows)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
      }
      poVar6 = plot::detail::operator<<((ostream *)&std::cout,&local_2c8);
      local_208.margin_ =
           (Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)
           CONCAT71(local_208.margin_._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_208,1);
      plot::detail::margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>::next
                (&local_208,&local_2c8);
      pmVar9 = &local_208;
      pvVar10 = &local_2c8;
      for (lVar8 = 0xe; lVar8 != 0; lVar8 = lVar8 + -1) {
        pvVar10->margin_ = pmVar9->margin_;
        pmVar9 = (margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)
                 ((long)pmVar9 + (ulong)bVar11 * -0x10 + 8);
        pvVar10 = (value_type *)((long)pvVar10 + (ulong)bVar11 * -0x10 + 8);
      }
    } while (((local_2c8.line_.line_.line_.line_.it_._M_current != pbVar1) ||
             (local_2c8.line_.line_.overflow_ != 1)) || (local_2c8.overflow_ != sVar4));
    std::ostream::flush();
    if (run == 0) break;
    local_208.margin_ = (Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)0x0;
    local_208.overflow_ = 40000000;
    do {
      iVar5 = nanosleep((timespec *)&local_208,(timespec *)&local_208);
      if (iVar5 != -1) break;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    if (run == 0) break;
    local_334 = local_334 + 0.01;
    if (1.0 <= local_334) {
      fVar13 = truncf(local_334);
      local_334 = local_334 - fVar13;
    }
    local_208.margin_ =
         (Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)(ulong)local_230.mode;
    local_208.overflow_ =
         CONCAT44(local_208.overflow_._4_4_,
                  (int)((local_118.block_.block_)->canvas_).lines_ + (int)local_118.top_ +
                  (int)local_118.bottom_ + 2);
    plot::detail::operator<<
              ((ostream *)&std::cout,
               (ansi_manip_wrapper<plot::ansi::detail::cursor_move> *)&local_208);
    std::ostream::flush();
  }
  std::
  _Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>::
  ~_Fwd_list_base(&local_198.canvas_.available_layers_.
                   super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
                 );
  std::
  _Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>::
  ~_Fwd_list_base(&local_198.canvas_.stack_.
                   super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
                 );
  if (local_198.canvas_.blocks_.
      super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>.
      super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.canvas_.blocks_.
                    super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                    .
                    super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.canvas_.blocks_.
                          super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                          .
                          super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.canvas_.blocks_.
                          super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                          .
                          super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    std::signal(SIGINT, [](int) {
        run = false;
    });

    TerminalInfo term;
    term.detect();

    RealCanvas<BrailleCanvas> canvas({ { 0.0f, 1.0f }, { 1.0f, -1.0f } }, Size(30, 7), term);
    auto layout = margin(frame(&canvas, term));

    auto bounds = canvas.bounds();
    auto size = canvas.size();
    auto pixel = canvas.unmap_size({ 1, 1 });

    float A = size.y/2.0f;
    float f = 2.0f;

    auto sin = [A,f](float t) {
        return A*std::sin(2*3.141592f*f*t);
    };

    auto cos = [A,f](float t) {
        return A*std::cos(2*3.141592f*f*t);
    };

    auto plot_fn = [](auto const& fn, float t_) {
        return [&fn, t_](float x) -> Pointf {
            return { x, fn(t_ + x) };
        };
    };

    // Plot function in range [bounds.p1.x, bounds.p2.x] with step of 1px
    // Actually, the range is [bounds.p1.x, bounds.p2.x + 1px)
    range_iterator<float> rng(bounds.p1.x, bounds.p2.x + pixel.x, pixel.x);
    range_iterator<float> rng_end;

    float t = 0.0f;

    while (true) {
        canvas.clear()
              .path(palette::royalblue, map(rng, plot_fn(sin, t)), map(rng_end, plot_fn(sin, t)))
              .path(palette::red, map(rng, plot_fn(cos, t)), map(rng_end, plot_fn(cos, t)))
              .line(term.foreground_color, { bounds.p1.x, 0.0f }, { bounds.p2.x, 0.0f }, TerminalOp::ClipSrc);

        for (auto const& line: layout)
            std::cout << term.clear_line() << line << '\n';

        std::cout << std::flush;

        if (!run)
            break;

        using namespace std::chrono_literals;
        std::this_thread::sleep_for(40ms);

        if (!run)
            break;

        t += 0.01f;
        if (t >= 1.0f)
            t -= std::trunc(t);

        std::cout << term.move_up(layout.size().y) << std::flush;
    }

    return 0;
}